

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O0

void JPCommon_push(JPCommon *jpcommon,JPCommonNode *node)

{
  JPCommonNode *node_local;
  JPCommon *jpcommon_local;
  
  if (jpcommon->head == (JPCommonNode *)0x0) {
    jpcommon->head = node;
  }
  else {
    jpcommon->tail->next = node;
    node->prev = jpcommon->tail;
  }
  jpcommon->tail = node;
  return;
}

Assistant:

void JPCommon_push(JPCommon * jpcommon, JPCommonNode * node)
{
   if (jpcommon->head == NULL) {
      jpcommon->head = node;
   } else {
      jpcommon->tail->next = node;
      node->prev = jpcommon->tail;
   }
   jpcommon->tail = node;
}